

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::reparentFocusWidgets(QWidgetPrivate *this,QWidget *oldtlw)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  
  pQVar1 = *(QWidget **)&this->field_0x8;
  do {
    pQVar2 = pQVar1;
    pQVar1 = *(QWidget **)(*(long *)&pQVar2->field_0x8 + 0x10);
    if (pQVar1 == (QWidget *)0x0) break;
  } while (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  if (pQVar2 != oldtlw) {
    if (this->focus_child != (QWidget *)0x0) {
      QWidget::clearFocus(this->focus_child);
    }
    reparentFocusChildren(this,Next);
    return;
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentFocusWidgets(QWidget * oldtlw)
{
    Q_Q(QWidget);
    if (oldtlw == q->window())
        return; // nothing to do

    if (focus_child)
        focus_child->clearFocus();

    reparentFocusChildren(QWidgetPrivate::FocusDirection::Next);
}